

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 MemBackendFree(SyMemBackend *pBackend,void *pChunk)

{
  SyMemBlock *pSVar1;
  sxu32 sVar2;
  SyMemBlock *pSVar3;
  sxi32 in_EAX;
  sxi32 sVar4;
  
  sVar2 = pBackend->nBlock;
  if (sVar2 != 0) {
    pSVar1 = (SyMemBlock *)((long)pChunk + -0x10);
    if (pBackend->pBlocks == pSVar1) {
      pBackend->pBlocks = pBackend->pBlocks->pNext;
    }
    pSVar3 = *(SyMemBlock **)((long)pChunk + -8);
    if (pSVar3 != (SyMemBlock *)0x0) {
      pSVar3->pNext = pSVar1->pNext;
    }
    if (pSVar1->pNext != (SyMemBlock *)0x0) {
      pSVar1->pNext->pPrev = pSVar3;
    }
    pBackend->nBlock = sVar2 - 1;
    sVar4 = (*pBackend->pMethods->xFree)(pSVar1);
    return sVar4;
  }
  return in_EAX;
}

Assistant:

static sxi32 MemBackendFree(SyMemBackend *pBackend, void * pChunk)
{
	SyMemBlock *pBlock;
	pBlock = (SyMemBlock *)(((char *)pChunk) - sizeof(SyMemBlock));
#if defined(UNTRUST)
	if( pBlock->nGuard != SXMEM_BACKEND_MAGIC ){
		return SXERR_CORRUPT;
	}
#endif
	/* Unlink from the list of active blocks */
	if( pBackend->nBlock > 0 ){
		/* Release the block */
#if defined(UNTRUST)
		/* Mark as stale block */
		pBlock->nGuard = 0x635B;
#endif
		MACRO_LD_REMOVE(pBackend->pBlocks, pBlock);
		pBackend->nBlock--;
		pBackend->pMethods->xFree(pBlock);
	}
	return SXRET_OK;
}